

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O1

void __thiscall
HashtableAllTest_FindAndCountAndEqualRange_Test<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_FindAndCountAndEqualRange_Test<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *pHVar1;
  sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *this_00;
  sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *psVar2;
  undefined8 uVar3;
  int iVar4;
  undefined4 uVar5;
  iterator iVar6;
  const_iterator cVar7;
  long lVar8;
  pair<google::sparse_hashtable_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_google::sparse_hashtable_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *ppVar9;
  undefined8 *puVar10;
  sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  **ppsVar11;
  sparse_hashtable_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *psVar12;
  sparse_hashtable_const_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *psVar13;
  pointer piVar14;
  char *in_R9;
  bool bVar15;
  byte bVar16;
  pair<unsigned_long,_unsigned_long> pVar17;
  AssertionResult gtest_ar__4;
  AssertionResult gtest_ar__5;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar__1;
  TypeParam ht;
  AssertHelper local_3a8;
  AssertHelper local_3a0;
  undefined8 *local_398;
  sparse_hashtable_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  local_390;
  undefined1 local_348 [16];
  undefined1 local_338 [40];
  iterator local_310;
  nonempty_iterator local_308;
  sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *local_300 [9];
  sparse_hashtable_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  local_2b8;
  HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *local_270;
  undefined8 local_268;
  sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *local_260;
  sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *psStack_258;
  sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *local_250;
  pointer piStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 local_230;
  undefined8 uStack_228;
  HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *local_220;
  sparse_hashtable_const_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  local_218;
  sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *local_1d0;
  undefined8 local_1c8;
  sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *local_1c0;
  sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *psStack_1b8;
  sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *local_1b0;
  pointer piStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 local_190;
  undefined8 uStack_188;
  sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *local_180;
  AssertHelper local_178;
  undefined8 *puStack_170;
  undefined4 local_168;
  undefined4 uStack_164;
  undefined4 uStack_160;
  undefined4 uStack_15c;
  undefined4 local_158;
  undefined4 uStack_154;
  undefined4 uStack_150;
  undefined4 uStack_14c;
  undefined4 local_148;
  undefined4 uStack_144;
  undefined4 uStack_140;
  undefined4 uStack_13c;
  nonempty_iterator local_138;
  HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *local_130;
  undefined1 local_128 [8];
  undefined1 local_120 [24];
  nonempty_iterator local_108;
  sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *local_e0;
  vector<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
  local_d8 [2];
  iterator local_88;
  HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *local_40;
  
  bVar16 = 0;
  local_2b8.end.row_current._M_current =
       (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
       0x0;
  local_2b8.end.col_current = (nonempty_iterator)0x0;
  local_2b8.end.row_begin._M_current =
       (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
       0x0;
  local_2b8.end.row_end._M_current =
       (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
       0x0;
  local_2b8.pos.row_current._M_current =
       (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
       0x0;
  local_2b8.pos.col_current = (pointer)0x0;
  local_2b8.pos.row_begin._M_current =
       (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
       0x0;
  local_2b8.pos.row_end._M_current =
       (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
       0x0;
  local_270 = (HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
               *)0x0;
  local_260 = (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
               *)0x0;
  psStack_258 = (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                 *)0x0;
  local_250 = (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
               *)0x0;
  piStack_248 = (pointer)0x0;
  local_240 = 0;
  uStack_238 = 0;
  local_230 = 0;
  uStack_228 = 0;
  local_220 = (HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
               *)0x0;
  local_1d0 = (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
               *)0x0;
  local_218.end.row_current._M_current =
       (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
       0x0;
  local_218.end.col_current = (const_nonempty_iterator)0x0;
  local_218.end.row_begin._M_current =
       (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
       0x0;
  local_218.end.row_end._M_current =
       (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
       0x0;
  local_218.pos.row_current._M_current =
       (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
       0x0;
  local_218.pos.col_current = (pointer)0x0;
  local_218.pos.row_begin._M_current =
       (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
       0x0;
  local_218.pos.row_end._M_current =
       (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
       0x0;
  local_1c0 = (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
               *)0x0;
  psStack_1b8 = (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                 *)0x0;
  local_1b0 = (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
               *)0x0;
  piStack_1a8 = (pointer)0x0;
  local_1a0 = 0;
  uStack_198 = 0;
  local_190 = 0;
  uStack_188 = 0;
  local_180 = (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
               *)0x0;
  bVar15 = (this->
           super_HashtableAllTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           ).
           super_HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           .ht_.
           super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           .ht_.table.settings.num_buckets ==
           (this->
           super_HashtableAllTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           ).
           super_HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           .ht_.
           super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           .ht_.num_deleted;
  local_348[0] = (internal)bVar15;
  local_348._8_8_ =
       (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
       0x0;
  if (!bVar15) {
    testing::Message::Message((Message *)&local_178);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_128,(internal *)local_348,(AssertionResult *)"this->ht_.empty()",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_390,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x2ae,(char *)local_128);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_390,(Message *)&local_178);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_390);
    if (local_128 != (undefined1  [8])(local_120 + 8)) {
      operator_delete((void *)local_128);
    }
    if ((long *)CONCAT44(local_178.data_._4_4_,local_178.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_178.data_._4_4_,local_178.data_._0_4_) + 8))();
    }
  }
  uVar3 = local_348._8_8_;
  pHVar1 = &(this->
            super_HashtableAllTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            ).
            super_HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            .ht_;
  if ((sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
      local_348._8_8_ !=
      (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
      0x0) {
    if ((int **)*(pointer *)local_348._8_8_ !=
        &(((Settings *)(local_348._8_8_ + 8))->
         super_alloc_impl<Alloc<int,_unsigned_long,_18446744073709551615UL>_>).
         super_Alloc<int,_unsigned_long,_18446744073709551615UL>.count_) {
      operator_delete(*(pointer *)local_348._8_8_);
    }
    operator_delete((void *)uVar3);
  }
  iVar4 = UniqueObjectHelper<int>(1);
  local_390.ht = (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)CONCAT44(local_390.ht._4_4_,-iVar4);
  this_00 = &(this->
             super_HashtableAllTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ).
             super_HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             .ht_.
             super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             .ht_;
  google::
  sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::find<int>((iterator *)local_128,this_00,(int *)&local_390);
  local_348._8_8_ =
       (this->
       super_HashtableAllTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
       ).
       super_HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
       .ht_.
       super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
       .ht_.table.groups.
       super__Vector_base<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_338._0_8_ =
       (this->
       super_HashtableAllTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
       ).
       super_HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
       .ht_.
       super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
       .ht_.table.groups.
       super__Vector_base<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  bVar15 = false;
  local_338._16_8_ = (nonempty_iterator)0x0;
  local_308 = (nonempty_iterator)0x0;
  local_348._0_8_ = this_00;
  local_338._8_8_ = local_338._0_8_;
  local_338._24_8_ = local_348._8_8_;
  local_338._32_8_ = local_338._0_8_;
  local_310._M_current =
       (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
       local_338._0_8_;
  local_e0 = (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)pHVar1;
  google::
  sparse_hashtable_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::advance_past_deleted
            ((sparse_hashtable_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)local_348);
  if (local_120._0_8_ == local_348._8_8_) {
    if ((local_120._8_8_ == local_338._0_8_) && (local_120._16_8_ == local_338._8_8_)) {
      if (local_120._16_8_ == local_120._8_8_) {
        bVar15 = true;
      }
      else {
        bVar15 = local_108 == (nonempty_iterator)local_338._16_8_;
      }
    }
    else {
      bVar15 = false;
    }
  }
  local_178.data_._0_4_ = CONCAT31(local_178.data_._1_3_,bVar15);
  puStack_170 = (undefined8 *)0x0;
  if (bVar15 == false) {
    testing::Message::Message((Message *)local_348);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_128,(internal *)&local_178,
               (AssertionResult *)"this->ht_.find(this->UniqueKey(1)) == this->ht_.end()","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_390,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x2af,(char *)local_128);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_390,(Message *)local_348);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_390);
    if (local_128 != (undefined1  [8])(local_120 + 8)) {
      operator_delete((void *)local_128);
    }
    if ((sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)local_348._0_8_ !=
        (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      (**(code **)(*(long *)local_348._0_8_ + 8))();
    }
  }
  puVar10 = puStack_170;
  if (puStack_170 != (undefined8 *)0x0) {
    if ((undefined8 *)*puStack_170 != puStack_170 + 2) {
      operator_delete((undefined8 *)*puStack_170);
    }
    operator_delete(puVar10);
  }
  local_178.data_._0_4_ = 0;
  iVar4 = UniqueObjectHelper<int>(1);
  local_390.ht = (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)CONCAT44(local_390.ht._4_4_,-iVar4);
  pVar17 = google::
           sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
           ::find_position<int>(this_00,(int *)&local_390);
  local_348._1_7_ = 0;
  local_348[0] = (internal)(pVar17.first != 0xffffffffffffffff);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_128,"0u","this->ht_.count(this->UniqueKey(1))",(uint *)&local_178,
             (unsigned_long *)local_348);
  if (local_128[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_348);
    if ((pointer)local_120._0_8_ == (pointer)0x0) {
      piVar14 = (pointer)0xafc493;
    }
    else {
      piVar14 = *(pointer *)local_120._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_178,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x2b0,(char *)piVar14);
    testing::internal::AssertHelper::operator=(&local_178,(Message *)local_348);
    testing::internal::AssertHelper::~AssertHelper(&local_178);
    if ((sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)local_348._0_8_ !=
        (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      (**(code **)(*(long *)local_348._0_8_ + 8))();
    }
  }
  uVar3 = local_120._0_8_;
  if ((pointer)local_120._0_8_ != (pointer)0x0) {
    if ((int **)*(pointer *)local_120._0_8_ !=
        &(((Settings *)(local_120._0_8_ + 8))->
         super_alloc_impl<Alloc<int,_unsigned_long,_18446744073709551615UL>_>).
         super_Alloc<int,_unsigned_long,_18446744073709551615UL>.count_) {
      operator_delete(*(pointer *)local_120._0_8_);
    }
    operator_delete((void *)uVar3);
  }
  iVar4 = UniqueObjectHelper<int>(1);
  local_348._0_4_ = -iVar4;
  google::
  sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::equal_range<int>((pair<google::sparse_hashtable_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_google::sparse_hashtable_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      *)local_128,this_00,(int *)local_348);
  ppVar9 = (pair<google::sparse_hashtable_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_google::sparse_hashtable_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            *)local_128;
  psVar12 = &local_2b8;
  for (lVar8 = 9; lVar8 != 0; lVar8 = lVar8 + -1) {
    psVar12->ht = (ppVar9->first).ht;
    ppVar9 = (pair<google::sparse_hashtable_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_google::sparse_hashtable_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              *)((long)ppVar9 + (ulong)bVar16 * -0x10 + 8);
    psVar12 = (sparse_hashtable_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
               *)((long)psVar12 + ((ulong)bVar16 * -2 + 1) * 8);
  }
  ppsVar11 = &local_e0;
  puVar10 = &local_268;
  for (lVar8 = 9; lVar8 != 0; lVar8 = lVar8 + -1) {
    *puVar10 = *ppsVar11;
    ppsVar11 = ppsVar11 + (ulong)bVar16 * -2 + 1;
    puVar10 = puVar10 + (ulong)bVar16 * -2 + 1;
  }
  if (((local_2b8.pos.row_begin._M_current == local_260) &&
      (local_2b8.pos.row_end._M_current == psStack_258)) &&
     (local_2b8.pos.row_current._M_current == local_250)) {
    if (local_2b8.pos.row_current._M_current == local_2b8.pos.row_end._M_current) {
      bVar15 = true;
    }
    else {
      bVar15 = local_2b8.pos.col_current == piStack_248;
    }
  }
  else {
    bVar15 = false;
  }
  local_348[0] = (internal)bVar15;
  local_348._8_8_ =
       (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
       0x0;
  local_270 = pHVar1;
  local_220 = pHVar1;
  if (bVar15 == false) {
    testing::Message::Message((Message *)&local_178);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_128,(internal *)local_348,
               (AssertionResult *)"eq_pair.first == eq_pair.second","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_390,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x2b2,(char *)local_128);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_390,(Message *)&local_178);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_390);
    if (local_128 != (undefined1  [8])(local_120 + 8)) {
      operator_delete((void *)local_128);
    }
    if ((long *)CONCAT44(local_178.data_._4_4_,local_178.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_178.data_._4_4_,local_178.data_._0_4_) + 8))();
    }
  }
  uVar3 = local_348._8_8_;
  if ((sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
      local_348._8_8_ !=
      (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
      0x0) {
    if ((int **)*(pointer *)local_348._8_8_ !=
        &(((Settings *)(local_348._8_8_ + 8))->
         super_alloc_impl<Alloc<int,_unsigned_long,_18446744073709551615UL>_>).
         super_Alloc<int,_unsigned_long,_18446744073709551615UL>.count_) {
      operator_delete(*(pointer *)local_348._8_8_);
    }
    operator_delete((void *)uVar3);
  }
  iVar4 = UniqueObjectHelper<int>(1);
  local_348._0_4_ = iVar4;
  google::
  sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::resize_delta(this_00,1);
  google::
  sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::insert_noresize((pair<google::sparse_hashtable_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_bool>
                     *)local_128,this_00,(const_reference)local_348);
  bVar15 = (this->
           super_HashtableAllTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           ).
           super_HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           .ht_.
           super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           .ht_.table.settings.num_buckets !=
           (this->
           super_HashtableAllTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           ).
           super_HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           .ht_.
           super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           .ht_.num_deleted;
  local_348[0] = (internal)bVar15;
  local_348._8_8_ = (pointer)0x0;
  if (!bVar15) {
    testing::Message::Message((Message *)&local_178);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_128,(internal *)local_348,(AssertionResult *)"this->ht_.empty()",
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_390,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x2b5,(char *)local_128);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_390,(Message *)&local_178);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_390);
    if (local_128 != (undefined1  [8])(local_120 + 8)) {
      operator_delete((void *)local_128);
    }
    if ((long *)CONCAT44(local_178.data_._4_4_,local_178.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_178.data_._4_4_,local_178.data_._0_4_) + 8))();
    }
  }
  uVar3 = local_348._8_8_;
  if ((pointer)local_348._8_8_ != (pointer)0x0) {
    if ((int **)*(pointer *)local_348._8_8_ !=
        &(((Settings *)(local_348._8_8_ + 8))->
         super_alloc_impl<Alloc<int,_unsigned_long,_18446744073709551615UL>_>).
         super_Alloc<int,_unsigned_long,_18446744073709551615UL>.count_) {
      operator_delete(*(pointer *)local_348._8_8_);
    }
    operator_delete((void *)uVar3);
  }
  iVar4 = UniqueObjectHelper<int>(0xb);
  local_348._0_4_ = iVar4;
  google::
  sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::resize_delta(this_00,1);
  google::
  sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::insert_noresize((pair<google::sparse_hashtable_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_bool>
                     *)local_128,this_00,(const_reference)local_348);
  local_348._0_4_ = UniqueObjectHelper<int>(0x6f);
  google::
  sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::resize_delta(this_00,1);
  google::
  sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::insert_noresize((pair<google::sparse_hashtable_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_bool>
                     *)local_128,this_00,(const_reference)local_348);
  local_348._0_4_ = UniqueObjectHelper<int>(0x457);
  google::
  sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::resize_delta(this_00,1);
  google::
  sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::insert_noresize((pair<google::sparse_hashtable_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_bool>
                     *)local_128,this_00,(const_reference)local_348);
  local_348._0_4_ = UniqueObjectHelper<int>(0x2b67);
  google::
  sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::resize_delta(this_00,1);
  google::
  sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::insert_noresize((pair<google::sparse_hashtable_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_bool>
                     *)local_128,this_00,(const_reference)local_348);
  local_348._0_4_ = UniqueObjectHelper<int>(0x1b207);
  google::
  sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::resize_delta(this_00,1);
  google::
  sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::insert_noresize((pair<google::sparse_hashtable_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_bool>
                     *)local_128,this_00,(const_reference)local_348);
  local_348._0_4_ = UniqueObjectHelper<int>(0x10f447);
  google::
  sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::resize_delta(this_00,1);
  google::
  sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::insert_noresize((pair<google::sparse_hashtable_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_bool>
                     *)local_128,this_00,(const_reference)local_348);
  local_348._0_4_ = UniqueObjectHelper<int>(0xa98ac7);
  google::
  sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::resize_delta(this_00,1);
  google::
  sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::insert_noresize((pair<google::sparse_hashtable_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_bool>
                     *)local_128,this_00,(const_reference)local_348);
  local_348._0_4_ = UniqueObjectHelper<int>(0x69f6bc7);
  google::
  sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::resize_delta(this_00,1);
  google::
  sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::insert_noresize((pair<google::sparse_hashtable_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_bool>
                     *)local_128,this_00,(const_reference)local_348);
  local_178.data_._0_4_ = 9;
  local_348._0_8_ =
       (this->
       super_HashtableAllTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
       ).
       super_HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
       .ht_.
       super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
       .ht_.table.settings.num_buckets -
       (this->
       super_HashtableAllTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
       ).
       super_HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
       .ht_.
       super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
       .ht_.num_deleted;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_128,"9u","this->ht_.size()",(uint *)&local_178,
             (unsigned_long *)local_348);
  if (local_128[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_348);
    if ((pointer)local_120._0_8_ == (pointer)0x0) {
      piVar14 = (pointer)0xafc493;
    }
    else {
      piVar14 = *(pointer *)local_120._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_178,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x2be,(char *)piVar14);
    testing::internal::AssertHelper::operator=(&local_178,(Message *)local_348);
    testing::internal::AssertHelper::~AssertHelper(&local_178);
    if ((sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)local_348._0_8_ !=
        (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      (**(code **)(*(long *)local_348._0_8_ + 8))();
    }
  }
  uVar3 = local_120._0_8_;
  if ((pointer)local_120._0_8_ != (pointer)0x0) {
    if ((int **)*(pointer *)local_120._0_8_ !=
        &(((Settings *)(local_120._0_8_ + 8))->
         super_alloc_impl<Alloc<int,_unsigned_long,_18446744073709551615UL>_>).
         super_Alloc<int,_unsigned_long,_18446744073709551615UL>.count_) {
      operator_delete(*(pointer *)local_120._0_8_);
    }
    operator_delete((void *)uVar3);
  }
  iVar4 = UniqueObjectHelper<int>(1);
  local_128._0_4_ = -iVar4;
  google::
  sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::find<int>(&local_88,this_00,(int *)local_128);
  local_178.data_._0_4_ = local_88.ht._0_4_;
  local_178.data_._4_4_ = local_88.ht._4_4_;
  local_168 = local_88.pos.row_end._M_current._0_4_;
  uStack_164 = local_88.pos.row_end._M_current._4_4_;
  uStack_160 = local_88.pos.row_current._M_current._0_4_;
  uStack_15c = local_88.pos.row_current._M_current._4_4_;
  local_158 = local_88.pos.col_current._0_4_;
  uStack_154 = local_88.pos.col_current._4_4_;
  uStack_150 = local_88.end.row_begin._M_current._0_4_;
  uStack_14c = local_88.end.row_begin._M_current._4_4_;
  local_148 = local_88.end.row_end._M_current._0_4_;
  uStack_144 = local_88.end.row_end._M_current._4_4_;
  uStack_140 = local_88.end.row_current._M_current._0_4_;
  uStack_13c = local_88.end.row_current._M_current._4_4_;
  local_138 = local_88.end.col_current;
  local_130 = pHVar1;
  local_40 = pHVar1;
  iVar4 = (*(pHVar1->
            super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            )._vptr_BaseHashtableInterface[0xb])(pHVar1);
  local_348._0_4_ = iVar4;
  iVar4 = UniqueObjectHelper<int>(1);
  local_390.ht = (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)CONCAT44(local_390.ht._4_4_,-iVar4);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_128,"it.key()","this->UniqueKey(1)",(int *)local_348,
             (int *)&local_390);
  if (local_128[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_348);
    if ((pointer)local_120._0_8_ == (pointer)0x0) {
      piVar14 = (pointer)0xafc493;
    }
    else {
      piVar14 = *(pointer *)local_120._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_390,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x2c0,(char *)piVar14);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_390,(Message *)local_348);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_390);
    if ((sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)local_348._0_8_ !=
        (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      (**(code **)(*(long *)local_348._0_8_ + 8))();
    }
  }
  if ((pointer)local_120._0_8_ != (pointer)0x0) {
    if ((int **)*(pointer *)local_120._0_8_ !=
        &(((Settings *)(local_120._0_8_ + 8))->
         super_alloc_impl<Alloc<int,_unsigned_long,_18446744073709551615UL>_>).
         super_Alloc<int,_unsigned_long,_18446744073709551615UL>.count_) {
      operator_delete(*(pointer *)local_120._0_8_);
    }
    operator_delete((void *)local_120._0_8_);
  }
  local_128 = (undefined1  [8])&PTR__BaseHashtableInterface_00c231b8;
  google::
  sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::sparse_hashtable((sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                      *)local_120,this_00,0x20);
  local_128 = (undefined1  [8])&PTR__BaseHashtableInterface_00c23138;
  local_3a8.data_._0_4_ = UniqueObjectHelper<int>(1);
  local_3a8.data_._0_4_ = -(int)local_3a8.data_;
  google::
  sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::find<int>((iterator *)local_348,this_00,(int *)&local_3a8);
  local_390.pos.row_begin._M_current =
       (this->
       super_HashtableAllTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
       ).
       super_HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
       .ht_.
       super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
       .ht_.table.groups.
       super__Vector_base<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_390.pos.row_end._M_current =
       (this->
       super_HashtableAllTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
       ).
       super_HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
       .ht_.
       super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
       .ht_.table.groups.
       super__Vector_base<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_390.pos.col_current = (nonempty_iterator)0x0;
  local_390.end.col_current = (nonempty_iterator)0x0;
  local_390.ht = this_00;
  local_390.pos.row_current._M_current = local_390.pos.row_end._M_current;
  local_390.end.row_begin._M_current = local_390.pos.row_begin._M_current;
  local_390.end.row_end._M_current = local_390.pos.row_end._M_current;
  local_390.end.row_current._M_current = local_390.pos.row_end._M_current;
  local_300[0] = (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)pHVar1;
  google::
  sparse_hashtable_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::advance_past_deleted(&local_390);
  bVar15 = true;
  if ((((sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
        local_348._8_8_ == local_390.pos.row_begin._M_current) &&
      ((sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
       local_338._0_8_ == local_390.pos.row_end._M_current)) &&
     ((sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
      local_338._8_8_ == local_390.pos.row_current._M_current)) {
    if (local_338._8_8_ == local_338._0_8_) {
      bVar15 = false;
    }
    else {
      bVar15 = (nonempty_iterator)local_338._16_8_ != local_390.pos.col_current;
    }
  }
  local_3a0.data_._0_4_ = CONCAT31(local_3a0.data_._1_3_,bVar15);
  local_398 = (undefined8 *)0x0;
  if (bVar15 == false) {
    testing::Message::Message((Message *)&local_390);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_348,(internal *)&local_3a0,
               (AssertionResult *)"this->ht_.find(this->UniqueKey(1)) != this->ht_.end()","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x2c6,(char *)local_348._0_8_);
    testing::internal::AssertHelper::operator=(&local_3a8,(Message *)&local_390);
    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
    if ((sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)local_348._0_8_ !=
        (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)local_338) {
      operator_delete((void *)local_348._0_8_);
    }
    if (local_390.ht !=
        (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      (**(code **)(*(long *)&((local_390.ht)->settings).
                             super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.super_Hasher
                  + 8))();
    }
  }
  puVar10 = local_398;
  if (local_398 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_398 != local_398 + 2) {
      operator_delete((undefined8 *)*local_398);
    }
    operator_delete(puVar10);
  }
  local_3a0.data_._0_4_ = 1;
  local_3a8.data_._0_4_ = UniqueObjectHelper<int>(1);
  local_3a8.data_._0_4_ = -(int)local_3a8.data_;
  pVar17 = google::
           sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
           ::find_position<int>(this_00,(int *)&local_3a8);
  local_390.ht = (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)(ulong)(pVar17.first != 0xffffffffffffffff);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_348,"1u","this->ht_.count(this->UniqueKey(1))",(uint *)&local_3a0,
             (unsigned_long *)&local_390);
  if (local_348[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_390);
    if ((pointer)local_348._8_8_ == (pointer)0x0) {
      piVar14 = (pointer)0xafc493;
    }
    else {
      piVar14 = *(pointer *)local_348._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x2c7,(char *)piVar14);
    testing::internal::AssertHelper::operator=(&local_3a0,(Message *)&local_390);
    testing::internal::AssertHelper::~AssertHelper(&local_3a0);
    if (local_390.ht !=
        (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      (**(code **)(*(long *)&((local_390.ht)->settings).
                             super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.super_Hasher
                  + 8))();
    }
  }
  uVar3 = local_348._8_8_;
  if ((pointer)local_348._8_8_ != (pointer)0x0) {
    if ((int **)*(pointer *)local_348._8_8_ !=
        &(((Settings *)(local_348._8_8_ + 8))->
         super_alloc_impl<Alloc<int,_unsigned_long,_18446744073709551615UL>_>).
         super_Alloc<int,_unsigned_long,_18446744073709551615UL>.count_) {
      operator_delete(*(pointer *)local_348._8_8_);
    }
    operator_delete((void *)uVar3);
  }
  iVar4 = UniqueObjectHelper<int>(1);
  local_390.ht = (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)CONCAT44(local_390.ht._4_4_,-iVar4);
  google::
  sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::equal_range<int>((pair<google::sparse_hashtable_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_google::sparse_hashtable_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      *)local_348,this_00,(int *)&local_390);
  puVar10 = (undefined8 *)local_348;
  psVar12 = &local_2b8;
  for (lVar8 = 9; lVar8 != 0; lVar8 = lVar8 + -1) {
    psVar12->ht = (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                   *)*puVar10;
    puVar10 = puVar10 + (ulong)bVar16 * -2 + 1;
    psVar12 = (sparse_hashtable_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
               *)((long)psVar12 + ((ulong)bVar16 * -2 + 1) * 8);
  }
  ppsVar11 = local_300;
  puVar10 = &local_268;
  for (lVar8 = 9; lVar8 != 0; lVar8 = lVar8 + -1) {
    *puVar10 = *ppsVar11;
    ppsVar11 = ppsVar11 + (ulong)bVar16 * -2 + 1;
    puVar10 = puVar10 + (ulong)bVar16 * -2 + 1;
  }
  bVar15 = true;
  if (((local_2b8.pos.row_begin._M_current == local_260) &&
      (local_2b8.pos.row_end._M_current == psStack_258)) &&
     (local_2b8.pos.row_current._M_current == local_250)) {
    if (local_2b8.pos.row_current._M_current == local_2b8.pos.row_end._M_current) {
      bVar15 = false;
    }
    else {
      bVar15 = local_2b8.pos.col_current != piStack_248;
    }
  }
  local_390.ht = (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)CONCAT71(local_390.ht._1_7_,bVar15);
  local_390.pos.row_begin._M_current =
       (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
       0x0;
  local_270 = pHVar1;
  local_220 = pHVar1;
  if (bVar15 == false) {
    testing::Message::Message((Message *)&local_3a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_348,(internal *)&local_390,
               (AssertionResult *)"eq_pair.first != eq_pair.second","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x2c9,(char *)local_348._0_8_);
    testing::internal::AssertHelper::operator=(&local_3a8,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_348._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_338) {
      operator_delete((void *)local_348._0_8_);
    }
    if ((long *)CONCAT44(local_3a0.data_._4_4_,(int)local_3a0.data_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_3a0.data_._4_4_,(int)local_3a0.data_) + 8))();
    }
  }
  iVar6._M_current = local_390.pos.row_begin._M_current;
  if (local_390.pos.row_begin._M_current !=
      (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
      0x0) {
    if ((int **)(local_390.pos.row_begin._M_current)->group !=
        &((local_390.pos.row_begin._M_current)->settings).
         super_alloc_impl<Alloc<int,_unsigned_long,_18446744073709551615UL>_>.
         super_Alloc<int,_unsigned_long,_18446744073709551615UL>.count_) {
      operator_delete((local_390.pos.row_begin._M_current)->group);
    }
    operator_delete(iVar6._M_current);
  }
  iVar4 = (*(local_270->
            super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            )._vptr_BaseHashtableInterface[10])();
  local_390.ht = (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)CONCAT44(local_390.ht._4_4_,iVar4);
  local_3a0.data_._0_4_ = UniqueObjectHelper<int>(1);
  local_3a0.data_._0_4_ = -(int)local_3a0.data_;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_348,"eq_pair.first.key()","this->UniqueKey(1)",(int *)&local_390,
             (int *)&local_3a0);
  if (local_348[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_390);
    if ((pointer)local_348._8_8_ == (pointer)0x0) {
      piVar14 = (pointer)0xafc493;
    }
    else {
      piVar14 = *(pointer *)local_348._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x2ca,(char *)piVar14);
    testing::internal::AssertHelper::operator=(&local_3a0,(Message *)&local_390);
    testing::internal::AssertHelper::~AssertHelper(&local_3a0);
    if (local_390.ht !=
        (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      (**(code **)(*(long *)&((local_390.ht)->settings).
                             super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.super_Hasher
                  + 8))();
    }
  }
  uVar3 = local_348._8_8_;
  if ((pointer)local_348._8_8_ != (pointer)0x0) {
    if ((int **)*(pointer *)local_348._8_8_ !=
        &(((Settings *)(local_348._8_8_ + 8))->
         super_alloc_impl<Alloc<int,_unsigned_long,_18446744073709551615UL>_>).
         super_Alloc<int,_unsigned_long,_18446744073709551615UL>.count_) {
      operator_delete(*(pointer *)local_348._8_8_);
    }
    operator_delete((void *)uVar3);
  }
  local_2b8.pos.col_current = local_2b8.pos.col_current + 1;
  iVar6._M_current = local_2b8.pos.row_current._M_current;
  if (local_2b8.pos.col_current ==
      (local_2b8.pos.row_current._M_current)->group +
      ((local_2b8.pos.row_current._M_current)->settings).num_buckets) {
    do {
      iVar6._M_current = local_2b8.pos.row_current._M_current + 1;
      if (iVar6._M_current == local_2b8.pos.row_end._M_current) break;
      local_2b8.pos.col_current = (iVar6._M_current)->group;
      psVar2 = local_2b8.pos.row_current._M_current + 1;
      local_2b8.pos.row_current._M_current = iVar6._M_current;
    } while ((psVar2->settings).num_buckets == 0);
  }
  local_2b8.pos.row_current._M_current = iVar6._M_current;
  google::
  sparse_hashtable_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::advance_past_deleted(&local_2b8);
  if (((local_2b8.pos.row_begin._M_current == local_260) &&
      (local_2b8.pos.row_end._M_current == psStack_258)) &&
     (local_2b8.pos.row_current._M_current == local_250)) {
    if (local_2b8.pos.row_current._M_current == local_2b8.pos.row_end._M_current) {
      bVar15 = true;
    }
    else {
      bVar15 = local_2b8.pos.col_current == piStack_248;
    }
  }
  else {
    bVar15 = false;
  }
  local_390.ht = (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)CONCAT71(local_390.ht._1_7_,bVar15);
  local_390.pos.row_begin._M_current =
       (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
       0x0;
  if (bVar15 == false) {
    testing::Message::Message((Message *)&local_3a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_348,(internal *)&local_390,
               (AssertionResult *)"eq_pair.first == eq_pair.second","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x2cc,(char *)local_348._0_8_);
    testing::internal::AssertHelper::operator=(&local_3a8,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
    if ((sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)local_348._0_8_ !=
        (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)local_338) {
      operator_delete((void *)local_348._0_8_);
    }
    if ((long *)CONCAT44(local_3a0.data_._4_4_,(int)local_3a0.data_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_3a0.data_._4_4_,(int)local_3a0.data_) + 8))();
    }
  }
  iVar6._M_current = local_390.pos.row_begin._M_current;
  if (local_390.pos.row_begin._M_current !=
      (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
      0x0) {
    if ((int **)(local_390.pos.row_begin._M_current)->group !=
        &((local_390.pos.row_begin._M_current)->settings).
         super_alloc_impl<Alloc<int,_unsigned_long,_18446744073709551615UL>_>.
         super_Alloc<int,_unsigned_long,_18446744073709551615UL>.count_) {
      operator_delete((local_390.pos.row_begin._M_current)->group);
    }
    operator_delete(iVar6._M_current);
  }
  local_3a8.data_._0_4_ = UniqueObjectHelper<int>(1);
  local_3a8.data_._0_4_ = -(int)local_3a8.data_;
  google::
  sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::find<int>((const_iterator *)local_348,
              (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
               *)local_120,(int *)&local_3a8);
  local_390.pos.row_begin._M_current =
       local_d8[0].
       super__Vector_base<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_390.pos.row_end._M_current =
       local_d8[0].
       super__Vector_base<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_390.pos.row_current._M_current =
       local_d8[0].
       super__Vector_base<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_390.pos.col_current = (nonempty_iterator)0x0;
  local_390.end.row_begin._M_current =
       local_d8[0].
       super__Vector_base<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_390.end.row_end._M_current =
       local_d8[0].
       super__Vector_base<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_390.end.row_current._M_current =
       local_d8[0].
       super__Vector_base<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_390.end.col_current = (nonempty_iterator)0x0;
  local_390.ht = (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)local_120;
  local_300[0] = (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)local_128;
  google::
  sparse_hashtable_const_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::advance_past_deleted
            ((sparse_hashtable_const_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)&local_390);
  bVar15 = true;
  if ((((sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
        local_348._8_8_ == local_390.pos.row_begin._M_current) &&
      ((sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
       local_338._0_8_ == local_390.pos.row_end._M_current)) &&
     ((sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
      local_338._8_8_ == local_390.pos.row_current._M_current)) {
    if (local_338._8_8_ == local_338._0_8_) {
      bVar15 = false;
    }
    else {
      bVar15 = (nonempty_iterator)local_338._16_8_ != local_390.pos.col_current;
    }
  }
  local_3a0.data_._0_4_ = CONCAT31(local_3a0.data_._1_3_,bVar15);
  local_398 = (undefined8 *)0x0;
  if (bVar15 == false) {
    testing::Message::Message((Message *)&local_390);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_348,(internal *)&local_3a0,
               (AssertionResult *)"ht.find(this->UniqueKey(1)) != ht.end()","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x2ce,(char *)local_348._0_8_);
    testing::internal::AssertHelper::operator=(&local_3a8,(Message *)&local_390);
    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
    if ((undefined1 *)local_348._0_8_ != local_338) {
      operator_delete((void *)local_348._0_8_);
    }
    if (local_390.ht !=
        (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      (**(code **)(*(long *)&((local_390.ht)->settings).
                             super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.super_Hasher
                  + 8))();
    }
  }
  puVar10 = local_398;
  if (local_398 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_398 != local_398 + 2) {
      operator_delete((undefined8 *)*local_398);
    }
    operator_delete(puVar10);
  }
  local_3a0.data_._0_4_ = 1;
  local_3a8.data_._0_4_ = UniqueObjectHelper<int>(1);
  local_3a8.data_._0_4_ = -(int)local_3a8.data_;
  pVar17 = google::
           sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
           ::find_position<int>
                     ((sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                       *)local_120,(int *)&local_3a8);
  local_390.ht = (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)(ulong)(pVar17.first != 0xffffffffffffffff);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_348,"1u","ht.count(this->UniqueKey(1))",(uint *)&local_3a0,
             (unsigned_long *)&local_390);
  if (local_348[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_390);
    if ((pointer)local_348._8_8_ == (pointer)0x0) {
      piVar14 = (pointer)0xafc493;
    }
    else {
      piVar14 = *(pointer *)local_348._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x2cf,(char *)piVar14);
    testing::internal::AssertHelper::operator=(&local_3a0,(Message *)&local_390);
    testing::internal::AssertHelper::~AssertHelper(&local_3a0);
    if (local_390.ht !=
        (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      (**(code **)(*(long *)&((local_390.ht)->settings).
                             super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.super_Hasher
                  + 8))();
    }
  }
  uVar3 = local_348._8_8_;
  if ((pointer)local_348._8_8_ != (pointer)0x0) {
    if ((int **)*(pointer *)local_348._8_8_ !=
        &(((Settings *)(local_348._8_8_ + 8))->
         super_alloc_impl<Alloc<int,_unsigned_long,_18446744073709551615UL>_>).
         super_Alloc<int,_unsigned_long,_18446744073709551615UL>.count_) {
      operator_delete(*(pointer *)local_348._8_8_);
    }
    operator_delete((void *)uVar3);
  }
  iVar4 = UniqueObjectHelper<int>(1);
  local_390.ht = (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)CONCAT44(local_390.ht._4_4_,-iVar4);
  google::
  sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::equal_range<int>((pair<google::sparse_hashtable_const_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_google::sparse_hashtable_const_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      *)local_348,
                     (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                      *)local_120,(int *)&local_390);
  puVar10 = (undefined8 *)local_348;
  psVar13 = &local_218;
  for (lVar8 = 9; lVar8 != 0; lVar8 = lVar8 + -1) {
    psVar13->ht = (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                   *)*puVar10;
    puVar10 = puVar10 + (ulong)bVar16 * -2 + 1;
    psVar13 = (sparse_hashtable_const_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
               *)((long)psVar13 + ((ulong)bVar16 * -2 + 1) * 8);
  }
  ppsVar11 = local_300;
  puVar10 = &local_1c8;
  for (lVar8 = 9; lVar8 != 0; lVar8 = lVar8 + -1) {
    *puVar10 = *ppsVar11;
    ppsVar11 = ppsVar11 + (ulong)bVar16 * -2 + 1;
    puVar10 = puVar10 + (ulong)bVar16 * -2 + 1;
  }
  bVar15 = true;
  if (((local_218.pos.row_begin._M_current == local_1c0) &&
      (local_218.pos.row_end._M_current == psStack_1b8)) &&
     (local_218.pos.row_current._M_current == local_1b0)) {
    if (local_218.pos.row_current._M_current == local_218.pos.row_end._M_current) {
      bVar15 = false;
    }
    else {
      bVar15 = local_218.pos.col_current != piStack_1a8;
    }
  }
  local_390.ht = (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)CONCAT71(local_390.ht._1_7_,bVar15);
  local_390.pos.row_begin._M_current =
       (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
       0x0;
  local_1d0 = (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
               *)local_128;
  local_180 = (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
               *)local_128;
  if (bVar15 == false) {
    testing::Message::Message((Message *)&local_3a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_348,(internal *)&local_390,
               (AssertionResult *)"const_eq_pair.first != const_eq_pair.second","false","true",in_R9
              );
    testing::internal::AssertHelper::AssertHelper
              (&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x2d1,(char *)local_348._0_8_);
    testing::internal::AssertHelper::operator=(&local_3a8,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
    if ((sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)local_348._0_8_ !=
        (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)local_338) {
      operator_delete((void *)local_348._0_8_);
    }
    if ((long *)CONCAT44(local_3a0.data_._4_4_,(int)local_3a0.data_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_3a0.data_._4_4_,(int)local_3a0.data_) + 8))();
    }
  }
  iVar6._M_current = local_390.pos.row_begin._M_current;
  if (local_390.pos.row_begin._M_current !=
      (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
      0x0) {
    if ((int **)(local_390.pos.row_begin._M_current)->group !=
        &((local_390.pos.row_begin._M_current)->settings).
         super_alloc_impl<Alloc<int,_unsigned_long,_18446744073709551615UL>_>.
         super_Alloc<int,_unsigned_long,_18446744073709551615UL>.count_) {
      operator_delete((local_390.pos.row_begin._M_current)->group);
    }
    operator_delete(iVar6._M_current);
  }
  uVar5 = (**(code **)(*(long *)&(local_1d0->settings).
                                 super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.
                                 super_Hasher + 0x58))();
  local_390.ht = (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)CONCAT44(local_390.ht._4_4_,uVar5);
  local_3a0.data_._0_4_ = UniqueObjectHelper<int>(1);
  local_3a0.data_._0_4_ = -(int)local_3a0.data_;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_348,"const_eq_pair.first.key()","this->UniqueKey(1)",
             (int *)&local_390,(int *)&local_3a0);
  if (local_348[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_390);
    if ((pointer)local_348._8_8_ == (pointer)0x0) {
      piVar14 = (pointer)0xafc493;
    }
    else {
      piVar14 = *(pointer *)local_348._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x2d2,(char *)piVar14);
    testing::internal::AssertHelper::operator=(&local_3a0,(Message *)&local_390);
    testing::internal::AssertHelper::~AssertHelper(&local_3a0);
    if (local_390.ht !=
        (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      (**(code **)(*(long *)&((local_390.ht)->settings).
                             super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.super_Hasher
                  + 8))();
    }
  }
  uVar3 = local_348._8_8_;
  if ((pointer)local_348._8_8_ != (pointer)0x0) {
    if ((int **)*(pointer *)local_348._8_8_ !=
        &(((Settings *)(local_348._8_8_ + 8))->
         super_alloc_impl<Alloc<int,_unsigned_long,_18446744073709551615UL>_>).
         super_Alloc<int,_unsigned_long,_18446744073709551615UL>.count_) {
      operator_delete(*(pointer *)local_348._8_8_);
    }
    operator_delete((void *)uVar3);
  }
  local_218.pos.col_current = local_218.pos.col_current + 1;
  cVar7._M_current = local_218.pos.row_current._M_current;
  if (local_218.pos.col_current ==
      (local_218.pos.row_current._M_current)->group +
      ((local_218.pos.row_current._M_current)->settings).num_buckets) {
    do {
      cVar7._M_current = local_218.pos.row_current._M_current + 1;
      if (cVar7._M_current == local_218.pos.row_end._M_current) break;
      local_218.pos.col_current = (cVar7._M_current)->group;
      psVar2 = local_218.pos.row_current._M_current + 1;
      local_218.pos.row_current._M_current = cVar7._M_current;
    } while ((psVar2->settings).num_buckets == 0);
  }
  local_218.pos.row_current._M_current = cVar7._M_current;
  google::
  sparse_hashtable_const_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::advance_past_deleted(&local_218);
  if (((local_218.pos.row_begin._M_current == local_1c0) &&
      (local_218.pos.row_end._M_current == psStack_1b8)) &&
     (local_218.pos.row_current._M_current == local_1b0)) {
    if (local_218.pos.row_current._M_current == local_218.pos.row_end._M_current) {
      bVar15 = true;
    }
    else {
      bVar15 = local_218.pos.col_current == piStack_1a8;
    }
  }
  else {
    bVar15 = false;
  }
  local_390.ht = (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)CONCAT71(local_390.ht._1_7_,bVar15);
  local_390.pos.row_begin._M_current =
       (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
       0x0;
  if (bVar15 == false) {
    testing::Message::Message((Message *)&local_3a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_348,(internal *)&local_390,
               (AssertionResult *)"const_eq_pair.first == const_eq_pair.second","false","true",in_R9
              );
    testing::internal::AssertHelper::AssertHelper
              (&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x2d4,(char *)local_348._0_8_);
    testing::internal::AssertHelper::operator=(&local_3a8,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
    if ((undefined1 *)local_348._0_8_ != local_338) {
      operator_delete((void *)local_348._0_8_);
    }
    if ((long *)CONCAT44(local_3a0.data_._4_4_,(int)local_3a0.data_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_3a0.data_._4_4_,(int)local_3a0.data_) + 8))();
    }
  }
  iVar6._M_current = local_390.pos.row_begin._M_current;
  if (local_390.pos.row_begin._M_current !=
      (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
      0x0) {
    if ((int **)(local_390.pos.row_begin._M_current)->group !=
        &((local_390.pos.row_begin._M_current)->settings).
         super_alloc_impl<Alloc<int,_unsigned_long,_18446744073709551615UL>_>.
         super_Alloc<int,_unsigned_long,_18446744073709551615UL>.count_) {
      operator_delete((local_390.pos.row_begin._M_current)->group);
    }
    operator_delete(iVar6._M_current);
  }
  local_3a8.data_._0_4_ = UniqueObjectHelper<int>(0x2b67);
  local_3a8.data_._0_4_ = -(int)local_3a8.data_;
  google::
  sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::find<int>((iterator *)local_348,this_00,(int *)&local_3a8);
  local_390.pos.row_begin._M_current =
       (this->
       super_HashtableAllTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
       ).
       super_HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
       .ht_.
       super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
       .ht_.table.groups.
       super__Vector_base<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_390.pos.row_end._M_current =
       (this->
       super_HashtableAllTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
       ).
       super_HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
       .ht_.
       super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
       .ht_.table.groups.
       super__Vector_base<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_390.pos.col_current = (nonempty_iterator)0x0;
  local_390.end.col_current = (nonempty_iterator)0x0;
  local_390.ht = this_00;
  local_390.pos.row_current._M_current = local_390.pos.row_end._M_current;
  local_390.end.row_begin._M_current = local_390.pos.row_begin._M_current;
  local_390.end.row_end._M_current = local_390.pos.row_end._M_current;
  local_390.end.row_current._M_current = local_390.pos.row_end._M_current;
  local_300[0] = (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)pHVar1;
  google::
  sparse_hashtable_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::advance_past_deleted(&local_390);
  bVar15 = true;
  if ((((sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
        local_348._8_8_ == local_390.pos.row_begin._M_current) &&
      ((sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
       local_338._0_8_ == local_390.pos.row_end._M_current)) &&
     ((sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
      local_338._8_8_ == local_390.pos.row_current._M_current)) {
    if (local_338._8_8_ == local_338._0_8_) {
      bVar15 = false;
    }
    else {
      bVar15 = (nonempty_iterator)local_338._16_8_ != local_390.pos.col_current;
    }
  }
  local_3a0.data_._0_4_ = CONCAT31(local_3a0.data_._1_3_,bVar15);
  local_398 = (undefined8 *)0x0;
  if (bVar15 == false) {
    testing::Message::Message((Message *)&local_390);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_348,(internal *)&local_3a0,
               (AssertionResult *)"this->ht_.find(this->UniqueKey(11111)) != this->ht_.end()",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x2d6,(char *)local_348._0_8_);
    testing::internal::AssertHelper::operator=(&local_3a8,(Message *)&local_390);
    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
    if ((sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)local_348._0_8_ !=
        (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)local_338) {
      operator_delete((void *)local_348._0_8_);
    }
    if (local_390.ht !=
        (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      (**(code **)(*(long *)&((local_390.ht)->settings).
                             super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.super_Hasher
                  + 8))();
    }
  }
  puVar10 = local_398;
  if (local_398 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_398 != local_398 + 2) {
      operator_delete((undefined8 *)*local_398);
    }
    operator_delete(puVar10);
  }
  local_3a0.data_._0_4_ = 1;
  local_3a8.data_._0_4_ = UniqueObjectHelper<int>(0x2b67);
  local_3a8.data_._0_4_ = -(int)local_3a8.data_;
  pVar17 = google::
           sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
           ::find_position<int>(this_00,(int *)&local_3a8);
  local_390.ht = (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)(ulong)(pVar17.first != 0xffffffffffffffff);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_348,"1u","this->ht_.count(this->UniqueKey(11111))",(uint *)&local_3a0
             ,(unsigned_long *)&local_390);
  if (local_348[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_390);
    if ((pointer)local_348._8_8_ == (pointer)0x0) {
      piVar14 = (pointer)0xafc493;
    }
    else {
      piVar14 = *(pointer *)local_348._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x2d7,(char *)piVar14);
    testing::internal::AssertHelper::operator=(&local_3a0,(Message *)&local_390);
    testing::internal::AssertHelper::~AssertHelper(&local_3a0);
    if (local_390.ht !=
        (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      (**(code **)(*(long *)&((local_390.ht)->settings).
                             super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.super_Hasher
                  + 8))();
    }
  }
  uVar3 = local_348._8_8_;
  if ((pointer)local_348._8_8_ != (pointer)0x0) {
    if ((int **)*(pointer *)local_348._8_8_ !=
        &(((Settings *)(local_348._8_8_ + 8))->
         super_alloc_impl<Alloc<int,_unsigned_long,_18446744073709551615UL>_>).
         super_Alloc<int,_unsigned_long,_18446744073709551615UL>.count_) {
      operator_delete(*(pointer *)local_348._8_8_);
    }
    operator_delete((void *)uVar3);
  }
  iVar4 = UniqueObjectHelper<int>(0x2b67);
  local_390.ht = (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)CONCAT44(local_390.ht._4_4_,-iVar4);
  google::
  sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::equal_range<int>((pair<google::sparse_hashtable_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_google::sparse_hashtable_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      *)local_348,this_00,(int *)&local_390);
  puVar10 = (undefined8 *)local_348;
  psVar12 = &local_2b8;
  for (lVar8 = 9; lVar8 != 0; lVar8 = lVar8 + -1) {
    psVar12->ht = (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                   *)*puVar10;
    puVar10 = puVar10 + (ulong)bVar16 * -2 + 1;
    psVar12 = (sparse_hashtable_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
               *)((long)psVar12 + ((ulong)bVar16 * -2 + 1) * 8);
  }
  ppsVar11 = local_300;
  puVar10 = &local_268;
  for (lVar8 = 9; lVar8 != 0; lVar8 = lVar8 + -1) {
    *puVar10 = *ppsVar11;
    ppsVar11 = ppsVar11 + (ulong)bVar16 * -2 + 1;
    puVar10 = puVar10 + (ulong)bVar16 * -2 + 1;
  }
  bVar15 = true;
  if (((local_2b8.pos.row_begin._M_current == local_260) &&
      (local_2b8.pos.row_end._M_current == psStack_258)) &&
     (local_2b8.pos.row_current._M_current == local_250)) {
    if (local_2b8.pos.row_current._M_current == local_2b8.pos.row_end._M_current) {
      bVar15 = false;
    }
    else {
      bVar15 = local_2b8.pos.col_current != piStack_248;
    }
  }
  local_390.ht = (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)CONCAT71(local_390.ht._1_7_,bVar15);
  local_390.pos.row_begin._M_current =
       (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
       0x0;
  local_270 = pHVar1;
  local_220 = pHVar1;
  if (bVar15 == false) {
    testing::Message::Message((Message *)&local_3a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_348,(internal *)&local_390,
               (AssertionResult *)"eq_pair.first != eq_pair.second","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x2d9,(char *)local_348._0_8_);
    testing::internal::AssertHelper::operator=(&local_3a8,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_348._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_338) {
      operator_delete((void *)local_348._0_8_);
    }
    if ((long *)CONCAT44(local_3a0.data_._4_4_,(int)local_3a0.data_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_3a0.data_._4_4_,(int)local_3a0.data_) + 8))();
    }
  }
  iVar6._M_current = local_390.pos.row_begin._M_current;
  if (local_390.pos.row_begin._M_current !=
      (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
      0x0) {
    if ((int **)(local_390.pos.row_begin._M_current)->group !=
        &((local_390.pos.row_begin._M_current)->settings).
         super_alloc_impl<Alloc<int,_unsigned_long,_18446744073709551615UL>_>.
         super_Alloc<int,_unsigned_long,_18446744073709551615UL>.count_) {
      operator_delete((local_390.pos.row_begin._M_current)->group);
    }
    operator_delete(iVar6._M_current);
  }
  iVar4 = (*(local_270->
            super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            )._vptr_BaseHashtableInterface[10])();
  local_390.ht = (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)CONCAT44(local_390.ht._4_4_,iVar4);
  local_3a0.data_._0_4_ = UniqueObjectHelper<int>(0x2b67);
  local_3a0.data_._0_4_ = -(int)local_3a0.data_;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_348,"eq_pair.first.key()","this->UniqueKey(11111)",(int *)&local_390,
             (int *)&local_3a0);
  if (local_348[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_390);
    if ((pointer)local_348._8_8_ == (pointer)0x0) {
      piVar14 = (pointer)0xafc493;
    }
    else {
      piVar14 = *(pointer *)local_348._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x2da,(char *)piVar14);
    testing::internal::AssertHelper::operator=(&local_3a0,(Message *)&local_390);
    testing::internal::AssertHelper::~AssertHelper(&local_3a0);
    if (local_390.ht !=
        (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      (**(code **)(*(long *)&((local_390.ht)->settings).
                             super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.super_Hasher
                  + 8))();
    }
  }
  uVar3 = local_348._8_8_;
  if ((pointer)local_348._8_8_ != (pointer)0x0) {
    if ((int **)*(pointer *)local_348._8_8_ !=
        &(((Settings *)(local_348._8_8_ + 8))->
         super_alloc_impl<Alloc<int,_unsigned_long,_18446744073709551615UL>_>).
         super_Alloc<int,_unsigned_long,_18446744073709551615UL>.count_) {
      operator_delete(*(pointer *)local_348._8_8_);
    }
    operator_delete((void *)uVar3);
  }
  local_2b8.pos.col_current = local_2b8.pos.col_current + 1;
  iVar6._M_current = local_2b8.pos.row_current._M_current;
  if (local_2b8.pos.col_current ==
      (local_2b8.pos.row_current._M_current)->group +
      ((local_2b8.pos.row_current._M_current)->settings).num_buckets) {
    do {
      iVar6._M_current = local_2b8.pos.row_current._M_current + 1;
      if (iVar6._M_current == local_2b8.pos.row_end._M_current) break;
      local_2b8.pos.col_current = (iVar6._M_current)->group;
      psVar2 = local_2b8.pos.row_current._M_current + 1;
      local_2b8.pos.row_current._M_current = iVar6._M_current;
    } while ((psVar2->settings).num_buckets == 0);
  }
  local_2b8.pos.row_current._M_current = iVar6._M_current;
  google::
  sparse_hashtable_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::advance_past_deleted(&local_2b8);
  if (((local_2b8.pos.row_begin._M_current == local_260) &&
      (local_2b8.pos.row_end._M_current == psStack_258)) &&
     (local_2b8.pos.row_current._M_current == local_250)) {
    if (local_2b8.pos.row_current._M_current == local_2b8.pos.row_end._M_current) {
      bVar15 = true;
    }
    else {
      bVar15 = local_2b8.pos.col_current == piStack_248;
    }
  }
  else {
    bVar15 = false;
  }
  local_390.ht = (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)CONCAT71(local_390.ht._1_7_,bVar15);
  local_390.pos.row_begin._M_current =
       (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
       0x0;
  if (bVar15 == false) {
    testing::Message::Message((Message *)&local_3a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_348,(internal *)&local_390,
               (AssertionResult *)"eq_pair.first == eq_pair.second","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x2dc,(char *)local_348._0_8_);
    testing::internal::AssertHelper::operator=(&local_3a8,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
    if ((sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)local_348._0_8_ !=
        (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)local_338) {
      operator_delete((void *)local_348._0_8_);
    }
    if ((long *)CONCAT44(local_3a0.data_._4_4_,(int)local_3a0.data_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_3a0.data_._4_4_,(int)local_3a0.data_) + 8))();
    }
  }
  iVar6._M_current = local_390.pos.row_begin._M_current;
  if (local_390.pos.row_begin._M_current !=
      (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
      0x0) {
    if ((int **)(local_390.pos.row_begin._M_current)->group !=
        &((local_390.pos.row_begin._M_current)->settings).
         super_alloc_impl<Alloc<int,_unsigned_long,_18446744073709551615UL>_>.
         super_Alloc<int,_unsigned_long,_18446744073709551615UL>.count_) {
      operator_delete((local_390.pos.row_begin._M_current)->group);
    }
    operator_delete(iVar6._M_current);
  }
  local_3a8.data_._0_4_ = UniqueObjectHelper<int>(0x2b67);
  local_3a8.data_._0_4_ = -(int)local_3a8.data_;
  google::
  sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::find<int>((const_iterator *)local_348,
              (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
               *)local_120,(int *)&local_3a8);
  local_390.pos.row_begin._M_current =
       local_d8[0].
       super__Vector_base<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_390.pos.row_end._M_current =
       local_d8[0].
       super__Vector_base<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_390.pos.row_current._M_current =
       local_d8[0].
       super__Vector_base<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_390.pos.col_current = (nonempty_iterator)0x0;
  local_390.end.row_begin._M_current =
       local_d8[0].
       super__Vector_base<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_390.end.row_end._M_current =
       local_d8[0].
       super__Vector_base<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_390.end.row_current._M_current =
       local_d8[0].
       super__Vector_base<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_390.end.col_current = (nonempty_iterator)0x0;
  local_390.ht = (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)local_120;
  local_300[0] = (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)local_128;
  google::
  sparse_hashtable_const_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::advance_past_deleted
            ((sparse_hashtable_const_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)&local_390);
  bVar15 = true;
  if ((((sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
        local_348._8_8_ == local_390.pos.row_begin._M_current) &&
      ((sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
       local_338._0_8_ == local_390.pos.row_end._M_current)) &&
     ((sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
      local_338._8_8_ == local_390.pos.row_current._M_current)) {
    if (local_338._8_8_ == local_338._0_8_) {
      bVar15 = false;
    }
    else {
      bVar15 = (nonempty_iterator)local_338._16_8_ != local_390.pos.col_current;
    }
  }
  local_3a0.data_._0_4_ = CONCAT31(local_3a0.data_._1_3_,bVar15);
  local_398 = (undefined8 *)0x0;
  if (bVar15 == false) {
    testing::Message::Message((Message *)&local_390);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_348,(internal *)&local_3a0,
               (AssertionResult *)"ht.find(this->UniqueKey(11111)) != ht.end()","false","true",in_R9
              );
    testing::internal::AssertHelper::AssertHelper
              (&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x2de,(char *)local_348._0_8_);
    testing::internal::AssertHelper::operator=(&local_3a8,(Message *)&local_390);
    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
    if ((undefined1 *)local_348._0_8_ != local_338) {
      operator_delete((void *)local_348._0_8_);
    }
    if (local_390.ht !=
        (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      (**(code **)(*(long *)&((local_390.ht)->settings).
                             super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.super_Hasher
                  + 8))();
    }
  }
  puVar10 = local_398;
  if (local_398 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_398 != local_398 + 2) {
      operator_delete((undefined8 *)*local_398);
    }
    operator_delete(puVar10);
  }
  local_3a0.data_._0_4_ = 1;
  local_3a8.data_._0_4_ = UniqueObjectHelper<int>(0x2b67);
  local_3a8.data_._0_4_ = -(int)local_3a8.data_;
  pVar17 = google::
           sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
           ::find_position<int>
                     ((sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                       *)local_120,(int *)&local_3a8);
  local_390.ht = (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)(ulong)(pVar17.first != 0xffffffffffffffff);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_348,"1u","ht.count(this->UniqueKey(11111))",(uint *)&local_3a0,
             (unsigned_long *)&local_390);
  if (local_348[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_390);
    if ((pointer)local_348._8_8_ == (pointer)0x0) {
      piVar14 = (pointer)0xafc493;
    }
    else {
      piVar14 = *(pointer *)local_348._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x2df,(char *)piVar14);
    testing::internal::AssertHelper::operator=(&local_3a0,(Message *)&local_390);
    testing::internal::AssertHelper::~AssertHelper(&local_3a0);
    if (local_390.ht !=
        (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      (**(code **)(*(long *)&((local_390.ht)->settings).
                             super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.super_Hasher
                  + 8))();
    }
  }
  uVar3 = local_348._8_8_;
  if ((pointer)local_348._8_8_ != (pointer)0x0) {
    if ((int **)*(pointer *)local_348._8_8_ !=
        &(((Settings *)(local_348._8_8_ + 8))->
         super_alloc_impl<Alloc<int,_unsigned_long,_18446744073709551615UL>_>).
         super_Alloc<int,_unsigned_long,_18446744073709551615UL>.count_) {
      operator_delete(*(pointer *)local_348._8_8_);
    }
    operator_delete((void *)uVar3);
  }
  iVar4 = UniqueObjectHelper<int>(0x2b67);
  local_390.ht = (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)CONCAT44(local_390.ht._4_4_,-iVar4);
  google::
  sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::equal_range<int>((pair<google::sparse_hashtable_const_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_google::sparse_hashtable_const_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      *)local_348,
                     (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                      *)local_120,(int *)&local_390);
  puVar10 = (undefined8 *)local_348;
  psVar13 = &local_218;
  for (lVar8 = 9; lVar8 != 0; lVar8 = lVar8 + -1) {
    psVar13->ht = (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                   *)*puVar10;
    puVar10 = puVar10 + (ulong)bVar16 * -2 + 1;
    psVar13 = (sparse_hashtable_const_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
               *)((long)psVar13 + ((ulong)bVar16 * -2 + 1) * 8);
  }
  ppsVar11 = local_300;
  puVar10 = &local_1c8;
  for (lVar8 = 9; lVar8 != 0; lVar8 = lVar8 + -1) {
    *puVar10 = *ppsVar11;
    ppsVar11 = ppsVar11 + (ulong)bVar16 * -2 + 1;
    puVar10 = puVar10 + (ulong)bVar16 * -2 + 1;
  }
  bVar15 = true;
  if (((local_218.pos.row_begin._M_current == local_1c0) &&
      (local_218.pos.row_end._M_current == psStack_1b8)) &&
     (local_218.pos.row_current._M_current == local_1b0)) {
    if (local_218.pos.row_current._M_current == local_218.pos.row_end._M_current) {
      bVar15 = false;
    }
    else {
      bVar15 = local_218.pos.col_current != piStack_1a8;
    }
  }
  local_390.ht = (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)CONCAT71(local_390.ht._1_7_,bVar15);
  local_390.pos.row_begin._M_current =
       (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
       0x0;
  local_1d0 = (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
               *)local_128;
  local_180 = (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
               *)local_128;
  if (bVar15 == false) {
    testing::Message::Message((Message *)&local_3a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_348,(internal *)&local_390,
               (AssertionResult *)"const_eq_pair.first != const_eq_pair.second","false","true",in_R9
              );
    testing::internal::AssertHelper::AssertHelper
              (&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x2e1,(char *)local_348._0_8_);
    testing::internal::AssertHelper::operator=(&local_3a8,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
    if ((sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)local_348._0_8_ !=
        (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)local_338) {
      operator_delete((void *)local_348._0_8_);
    }
    if ((long *)CONCAT44(local_3a0.data_._4_4_,(int)local_3a0.data_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_3a0.data_._4_4_,(int)local_3a0.data_) + 8))();
    }
  }
  iVar6._M_current = local_390.pos.row_begin._M_current;
  if (local_390.pos.row_begin._M_current !=
      (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
      0x0) {
    if ((int **)(local_390.pos.row_begin._M_current)->group !=
        &((local_390.pos.row_begin._M_current)->settings).
         super_alloc_impl<Alloc<int,_unsigned_long,_18446744073709551615UL>_>.
         super_Alloc<int,_unsigned_long,_18446744073709551615UL>.count_) {
      operator_delete((local_390.pos.row_begin._M_current)->group);
    }
    operator_delete(iVar6._M_current);
  }
  uVar5 = (**(code **)(*(long *)&(local_1d0->settings).
                                 super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.
                                 super_Hasher + 0x58))();
  local_390.ht = (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)CONCAT44(local_390.ht._4_4_,uVar5);
  local_3a0.data_._0_4_ = UniqueObjectHelper<int>(0x2b67);
  local_3a0.data_._0_4_ = -(int)local_3a0.data_;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_348,"const_eq_pair.first.key()","this->UniqueKey(11111)",
             (int *)&local_390,(int *)&local_3a0);
  if (local_348[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_390);
    if ((pointer)local_348._8_8_ == (pointer)0x0) {
      piVar14 = (pointer)0xafc493;
    }
    else {
      piVar14 = *(pointer *)local_348._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x2e2,(char *)piVar14);
    testing::internal::AssertHelper::operator=(&local_3a0,(Message *)&local_390);
    testing::internal::AssertHelper::~AssertHelper(&local_3a0);
    if (local_390.ht !=
        (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      (**(code **)(*(long *)&((local_390.ht)->settings).
                             super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.super_Hasher
                  + 8))();
    }
  }
  uVar3 = local_348._8_8_;
  if ((pointer)local_348._8_8_ != (pointer)0x0) {
    if ((int **)*(pointer *)local_348._8_8_ !=
        &(((Settings *)(local_348._8_8_ + 8))->
         super_alloc_impl<Alloc<int,_unsigned_long,_18446744073709551615UL>_>).
         super_Alloc<int,_unsigned_long,_18446744073709551615UL>.count_) {
      operator_delete(*(pointer *)local_348._8_8_);
    }
    operator_delete((void *)uVar3);
  }
  local_218.pos.col_current = local_218.pos.col_current + 1;
  cVar7._M_current = local_218.pos.row_current._M_current;
  if (local_218.pos.col_current ==
      (local_218.pos.row_current._M_current)->group +
      ((local_218.pos.row_current._M_current)->settings).num_buckets) {
    do {
      cVar7._M_current = local_218.pos.row_current._M_current + 1;
      if (cVar7._M_current == local_218.pos.row_end._M_current) break;
      local_218.pos.col_current = (cVar7._M_current)->group;
      psVar2 = local_218.pos.row_current._M_current + 1;
      local_218.pos.row_current._M_current = cVar7._M_current;
    } while ((psVar2->settings).num_buckets == 0);
  }
  local_218.pos.row_current._M_current = cVar7._M_current;
  google::
  sparse_hashtable_const_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::advance_past_deleted(&local_218);
  if (((local_218.pos.row_begin._M_current == local_1c0) &&
      (local_218.pos.row_end._M_current == psStack_1b8)) &&
     (local_218.pos.row_current._M_current == local_1b0)) {
    if (local_218.pos.row_current._M_current == local_218.pos.row_end._M_current) {
      bVar15 = true;
    }
    else {
      bVar15 = local_218.pos.col_current == piStack_1a8;
    }
  }
  else {
    bVar15 = false;
  }
  local_390.ht = (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)CONCAT71(local_390.ht._1_7_,bVar15);
  local_390.pos.row_begin._M_current =
       (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
       0x0;
  if (bVar15 == false) {
    testing::Message::Message((Message *)&local_3a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_348,(internal *)&local_390,
               (AssertionResult *)"const_eq_pair.first == const_eq_pair.second","false","true",in_R9
              );
    testing::internal::AssertHelper::AssertHelper
              (&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x2e4,(char *)local_348._0_8_);
    testing::internal::AssertHelper::operator=(&local_3a8,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
    if ((undefined1 *)local_348._0_8_ != local_338) {
      operator_delete((void *)local_348._0_8_);
    }
    if ((long *)CONCAT44(local_3a0.data_._4_4_,(int)local_3a0.data_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_3a0.data_._4_4_,(int)local_3a0.data_) + 8))();
    }
  }
  iVar6._M_current = local_390.pos.row_begin._M_current;
  if (local_390.pos.row_begin._M_current !=
      (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
      0x0) {
    if ((int **)(local_390.pos.row_begin._M_current)->group !=
        &((local_390.pos.row_begin._M_current)->settings).
         super_alloc_impl<Alloc<int,_unsigned_long,_18446744073709551615UL>_>.
         super_Alloc<int,_unsigned_long,_18446744073709551615UL>.count_) {
      operator_delete((local_390.pos.row_begin._M_current)->group);
    }
    operator_delete(iVar6._M_current);
  }
  local_3a8.data_._0_4_ = UniqueObjectHelper<int>(0x2b68);
  local_3a8.data_._0_4_ = -(int)local_3a8.data_;
  google::
  sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::find<int>((iterator *)local_348,this_00,(int *)&local_3a8);
  local_390.pos.row_begin._M_current =
       (this->
       super_HashtableAllTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
       ).
       super_HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
       .ht_.
       super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
       .ht_.table.groups.
       super__Vector_base<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_390.pos.row_end._M_current =
       (this->
       super_HashtableAllTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
       ).
       super_HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
       .ht_.
       super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
       .ht_.table.groups.
       super__Vector_base<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_390.pos.col_current = (nonempty_iterator)0x0;
  local_390.end.col_current = (nonempty_iterator)0x0;
  local_390.ht = this_00;
  local_390.pos.row_current._M_current = local_390.pos.row_end._M_current;
  local_390.end.row_begin._M_current = local_390.pos.row_begin._M_current;
  local_390.end.row_end._M_current = local_390.pos.row_end._M_current;
  local_390.end.row_current._M_current = local_390.pos.row_end._M_current;
  local_300[0] = (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)pHVar1;
  google::
  sparse_hashtable_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::advance_past_deleted(&local_390);
  if ((((sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
        local_348._8_8_ == local_390.pos.row_begin._M_current) &&
      ((sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
       local_338._0_8_ == local_390.pos.row_end._M_current)) &&
     ((sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
      local_338._8_8_ == local_390.pos.row_current._M_current)) {
    if (local_338._8_8_ == local_338._0_8_) {
      bVar15 = true;
    }
    else {
      bVar15 = (nonempty_iterator)local_338._16_8_ == local_390.pos.col_current;
    }
  }
  else {
    bVar15 = false;
  }
  local_3a0.data_._0_4_ = CONCAT31(local_3a0.data_._1_3_,bVar15);
  local_398 = (undefined8 *)0x0;
  if (bVar15 == false) {
    testing::Message::Message((Message *)&local_390);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_348,(internal *)&local_3a0,
               (AssertionResult *)"this->ht_.find(this->UniqueKey(11112)) == this->ht_.end()",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x2e7,(char *)local_348._0_8_);
    testing::internal::AssertHelper::operator=(&local_3a8,(Message *)&local_390);
    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
    if ((sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)local_348._0_8_ !=
        (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)local_338) {
      operator_delete((void *)local_348._0_8_);
    }
    if (local_390.ht !=
        (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      (**(code **)(*(long *)&((local_390.ht)->settings).
                             super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.super_Hasher
                  + 8))();
    }
  }
  puVar10 = local_398;
  if (local_398 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_398 != local_398 + 2) {
      operator_delete((undefined8 *)*local_398);
    }
    operator_delete(puVar10);
  }
  local_3a0.data_._0_4_ = 0;
  local_3a8.data_._0_4_ = UniqueObjectHelper<int>(0x2b68);
  local_3a8.data_._0_4_ = -(int)local_3a8.data_;
  pVar17 = google::
           sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
           ::find_position<int>(this_00,(int *)&local_3a8);
  local_390.ht = (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)(ulong)(pVar17.first != 0xffffffffffffffff);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_348,"0u","this->ht_.count(this->UniqueKey(11112))",(uint *)&local_3a0
             ,(unsigned_long *)&local_390);
  if (local_348[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_390);
    if ((pointer)local_348._8_8_ == (pointer)0x0) {
      piVar14 = (pointer)0xafc493;
    }
    else {
      piVar14 = *(pointer *)local_348._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x2e8,(char *)piVar14);
    testing::internal::AssertHelper::operator=(&local_3a0,(Message *)&local_390);
    testing::internal::AssertHelper::~AssertHelper(&local_3a0);
    if (local_390.ht !=
        (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      (**(code **)(*(long *)&((local_390.ht)->settings).
                             super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.super_Hasher
                  + 8))();
    }
  }
  uVar3 = local_348._8_8_;
  if ((pointer)local_348._8_8_ != (pointer)0x0) {
    if ((int **)*(pointer *)local_348._8_8_ !=
        &(((Settings *)(local_348._8_8_ + 8))->
         super_alloc_impl<Alloc<int,_unsigned_long,_18446744073709551615UL>_>).
         super_Alloc<int,_unsigned_long,_18446744073709551615UL>.count_) {
      operator_delete(*(pointer *)local_348._8_8_);
    }
    operator_delete((void *)uVar3);
  }
  iVar4 = UniqueObjectHelper<int>(0x2b68);
  local_390.ht = (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)CONCAT44(local_390.ht._4_4_,-iVar4);
  google::
  sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::equal_range<int>((pair<google::sparse_hashtable_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_google::sparse_hashtable_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      *)local_348,this_00,(int *)&local_390);
  puVar10 = (undefined8 *)local_348;
  psVar12 = &local_2b8;
  for (lVar8 = 9; lVar8 != 0; lVar8 = lVar8 + -1) {
    psVar12->ht = (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                   *)*puVar10;
    puVar10 = puVar10 + (ulong)bVar16 * -2 + 1;
    psVar12 = (sparse_hashtable_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
               *)((long)psVar12 + ((ulong)bVar16 * -2 + 1) * 8);
  }
  ppsVar11 = local_300;
  puVar10 = &local_268;
  for (lVar8 = 9; lVar8 != 0; lVar8 = lVar8 + -1) {
    *puVar10 = *ppsVar11;
    ppsVar11 = ppsVar11 + (ulong)bVar16 * -2 + 1;
    puVar10 = puVar10 + (ulong)bVar16 * -2 + 1;
  }
  if (((local_2b8.pos.row_begin._M_current == local_260) &&
      (local_2b8.pos.row_end._M_current == psStack_258)) &&
     (local_2b8.pos.row_current._M_current == local_250)) {
    if (local_2b8.pos.row_current._M_current == local_2b8.pos.row_end._M_current) {
      bVar15 = true;
    }
    else {
      bVar15 = local_2b8.pos.col_current == piStack_248;
    }
  }
  else {
    bVar15 = false;
  }
  local_390.ht = (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)CONCAT71(local_390.ht._1_7_,bVar15);
  local_390.pos.row_begin._M_current =
       (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
       0x0;
  local_270 = pHVar1;
  local_220 = pHVar1;
  if (bVar15 == false) {
    testing::Message::Message((Message *)&local_3a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_348,(internal *)&local_390,
               (AssertionResult *)"eq_pair.first == eq_pair.second","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x2ea,(char *)local_348._0_8_);
    testing::internal::AssertHelper::operator=(&local_3a8,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_348._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_338) {
      operator_delete((void *)local_348._0_8_);
    }
    if ((long *)CONCAT44(local_3a0.data_._4_4_,(int)local_3a0.data_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_3a0.data_._4_4_,(int)local_3a0.data_) + 8))();
    }
  }
  iVar6._M_current = local_390.pos.row_begin._M_current;
  if (local_390.pos.row_begin._M_current !=
      (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
      0x0) {
    if ((int **)(local_390.pos.row_begin._M_current)->group !=
        &((local_390.pos.row_begin._M_current)->settings).
         super_alloc_impl<Alloc<int,_unsigned_long,_18446744073709551615UL>_>.
         super_Alloc<int,_unsigned_long,_18446744073709551615UL>.count_) {
      operator_delete((local_390.pos.row_begin._M_current)->group);
    }
    operator_delete(iVar6._M_current);
  }
  local_3a8.data_._0_4_ = UniqueObjectHelper<int>(0x2b68);
  local_3a8.data_._0_4_ = -(int)local_3a8.data_;
  google::
  sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::find<int>((const_iterator *)local_348,
              (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
               *)local_120,(int *)&local_3a8);
  local_390.pos.row_begin._M_current =
       local_d8[0].
       super__Vector_base<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_390.pos.row_end._M_current =
       local_d8[0].
       super__Vector_base<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_390.pos.row_current._M_current =
       local_d8[0].
       super__Vector_base<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_390.pos.col_current = (nonempty_iterator)0x0;
  local_390.end.row_begin._M_current =
       local_d8[0].
       super__Vector_base<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_390.end.row_end._M_current =
       local_d8[0].
       super__Vector_base<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_390.end.row_current._M_current =
       local_d8[0].
       super__Vector_base<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_390.end.col_current = (nonempty_iterator)0x0;
  local_390.ht = (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)local_120;
  local_300[0] = (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)local_128;
  google::
  sparse_hashtable_const_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::advance_past_deleted
            ((sparse_hashtable_const_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)&local_390);
  if ((((sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
        local_348._8_8_ == local_390.pos.row_begin._M_current) &&
      ((sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
       local_338._0_8_ == local_390.pos.row_end._M_current)) &&
     ((sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
      local_338._8_8_ == local_390.pos.row_current._M_current)) {
    if (local_338._8_8_ == local_338._0_8_) {
      bVar15 = true;
    }
    else {
      bVar15 = (nonempty_iterator)local_338._16_8_ == local_390.pos.col_current;
    }
  }
  else {
    bVar15 = false;
  }
  local_3a0.data_._0_4_ = CONCAT31(local_3a0.data_._1_3_,bVar15);
  local_398 = (undefined8 *)0x0;
  if (bVar15 == false) {
    testing::Message::Message((Message *)&local_390);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_348,(internal *)&local_3a0,
               (AssertionResult *)"ht.find(this->UniqueKey(11112)) == ht.end()","false","true",in_R9
              );
    testing::internal::AssertHelper::AssertHelper
              (&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x2ec,(char *)local_348._0_8_);
    testing::internal::AssertHelper::operator=(&local_3a8,(Message *)&local_390);
    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
    if ((undefined1 *)local_348._0_8_ != local_338) {
      operator_delete((void *)local_348._0_8_);
    }
    if (local_390.ht !=
        (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      (**(code **)(*(long *)&((local_390.ht)->settings).
                             super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.super_Hasher
                  + 8))();
    }
  }
  puVar10 = local_398;
  if (local_398 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_398 != local_398 + 2) {
      operator_delete((undefined8 *)*local_398);
    }
    operator_delete(puVar10);
  }
  local_3a0.data_._0_4_ = 0;
  local_3a8.data_._0_4_ = UniqueObjectHelper<int>(0x2b68);
  local_3a8.data_._0_4_ = -(int)local_3a8.data_;
  pVar17 = google::
           sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
           ::find_position<int>
                     ((sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                       *)local_120,(int *)&local_3a8);
  local_390.ht = (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)(ulong)(pVar17.first != 0xffffffffffffffff);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_348,"0u","ht.count(this->UniqueKey(11112))",(uint *)&local_3a0,
             (unsigned_long *)&local_390);
  if (local_348[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_390);
    if ((pointer)local_348._8_8_ == (pointer)0x0) {
      piVar14 = (pointer)0xafc493;
    }
    else {
      piVar14 = *(pointer *)local_348._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x2ed,(char *)piVar14);
    testing::internal::AssertHelper::operator=(&local_3a0,(Message *)&local_390);
    testing::internal::AssertHelper::~AssertHelper(&local_3a0);
    if (local_390.ht !=
        (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      (**(code **)(*(long *)&((local_390.ht)->settings).
                             super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.super_Hasher
                  + 8))();
    }
  }
  uVar3 = local_348._8_8_;
  if ((pointer)local_348._8_8_ != (pointer)0x0) {
    if ((int **)*(pointer *)local_348._8_8_ !=
        &(((Settings *)(local_348._8_8_ + 8))->
         super_alloc_impl<Alloc<int,_unsigned_long,_18446744073709551615UL>_>).
         super_Alloc<int,_unsigned_long,_18446744073709551615UL>.count_) {
      operator_delete(*(pointer *)local_348._8_8_);
    }
    operator_delete((void *)uVar3);
  }
  iVar4 = UniqueObjectHelper<int>(0x2b68);
  local_390.ht = (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)CONCAT44(local_390.ht._4_4_,-iVar4);
  google::
  sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::equal_range<int>((pair<google::sparse_hashtable_const_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_google::sparse_hashtable_const_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      *)local_348,
                     (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                      *)local_120,(int *)&local_390);
  puVar10 = (undefined8 *)local_348;
  psVar13 = &local_218;
  for (lVar8 = 9; lVar8 != 0; lVar8 = lVar8 + -1) {
    psVar13->ht = (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                   *)*puVar10;
    puVar10 = puVar10 + (ulong)bVar16 * -2 + 1;
    psVar13 = (sparse_hashtable_const_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
               *)((long)psVar13 + ((ulong)bVar16 * -2 + 1) * 8);
  }
  ppsVar11 = local_300;
  puVar10 = &local_1c8;
  for (lVar8 = 9; lVar8 != 0; lVar8 = lVar8 + -1) {
    *puVar10 = *ppsVar11;
    ppsVar11 = ppsVar11 + (ulong)bVar16 * -2 + 1;
    puVar10 = puVar10 + (ulong)bVar16 * -2 + 1;
  }
  if (((local_218.pos.row_begin._M_current == local_1c0) &&
      (local_218.pos.row_end._M_current == psStack_1b8)) &&
     (local_218.pos.row_current._M_current == local_1b0)) {
    if (local_218.pos.row_current._M_current == local_218.pos.row_end._M_current) {
      bVar15 = true;
    }
    else {
      bVar15 = local_218.pos.col_current == piStack_1a8;
    }
  }
  else {
    bVar15 = false;
  }
  local_390.ht = (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)CONCAT71(local_390.ht._1_7_,bVar15);
  local_390.pos.row_begin._M_current =
       (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
       0x0;
  local_1d0 = (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
               *)local_128;
  local_180 = (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
               *)local_128;
  if (bVar15 == false) {
    testing::Message::Message((Message *)&local_3a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_348,(internal *)&local_390,
               (AssertionResult *)"const_eq_pair.first == const_eq_pair.second","false","true",in_R9
              );
    testing::internal::AssertHelper::AssertHelper
              (&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x2ef,(char *)local_348._0_8_);
    testing::internal::AssertHelper::operator=(&local_3a8,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_348._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_338) {
      operator_delete((void *)local_348._0_8_);
    }
    if ((long *)CONCAT44(local_3a0.data_._4_4_,(int)local_3a0.data_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_3a0.data_._4_4_,(int)local_3a0.data_) + 8))();
    }
  }
  iVar6._M_current = local_390.pos.row_begin._M_current;
  if (local_390.pos.row_begin._M_current !=
      (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
      0x0) {
    if ((int **)(local_390.pos.row_begin._M_current)->group !=
        &((local_390.pos.row_begin._M_current)->settings).
         super_alloc_impl<Alloc<int,_unsigned_long,_18446744073709551615UL>_>.
         super_Alloc<int,_unsigned_long,_18446744073709551615UL>.count_) {
      operator_delete((local_390.pos.row_begin._M_current)->group);
    }
    operator_delete(iVar6._M_current);
  }
  local_3a8.data_._0_4_ = UniqueObjectHelper<int>(0x2b66);
  local_3a8.data_._0_4_ = -(int)local_3a8.data_;
  google::
  sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::find<int>((iterator *)local_348,this_00,(int *)&local_3a8);
  local_390.pos.row_begin._M_current =
       (this->
       super_HashtableAllTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
       ).
       super_HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
       .ht_.
       super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
       .ht_.table.groups.
       super__Vector_base<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_390.pos.row_end._M_current =
       (this->
       super_HashtableAllTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
       ).
       super_HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
       .ht_.
       super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
       .ht_.table.groups.
       super__Vector_base<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_390.pos.col_current = (nonempty_iterator)0x0;
  local_390.end.col_current = (nonempty_iterator)0x0;
  local_390.ht = this_00;
  local_390.pos.row_current._M_current = local_390.pos.row_end._M_current;
  local_390.end.row_begin._M_current = local_390.pos.row_begin._M_current;
  local_390.end.row_end._M_current = local_390.pos.row_end._M_current;
  local_390.end.row_current._M_current = local_390.pos.row_end._M_current;
  local_300[0] = (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)pHVar1;
  google::
  sparse_hashtable_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::advance_past_deleted(&local_390);
  if ((((sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
        local_348._8_8_ == local_390.pos.row_begin._M_current) &&
      ((sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
       local_338._0_8_ == local_390.pos.row_end._M_current)) &&
     ((sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
      local_338._8_8_ == local_390.pos.row_current._M_current)) {
    if (local_338._8_8_ == local_338._0_8_) {
      bVar15 = true;
    }
    else {
      bVar15 = (nonempty_iterator)local_338._16_8_ == local_390.pos.col_current;
    }
  }
  else {
    bVar15 = false;
  }
  local_3a0.data_._0_4_ = CONCAT31(local_3a0.data_._1_3_,bVar15);
  local_398 = (undefined8 *)0x0;
  if (bVar15 == false) {
    testing::Message::Message((Message *)&local_390);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_348,(internal *)&local_3a0,
               (AssertionResult *)"this->ht_.find(this->UniqueKey(11110)) == this->ht_.end()",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x2f1,(char *)local_348._0_8_);
    testing::internal::AssertHelper::operator=(&local_3a8,(Message *)&local_390);
    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
    if ((undefined1 *)local_348._0_8_ != local_338) {
      operator_delete((void *)local_348._0_8_);
    }
    if (local_390.ht !=
        (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      (**(code **)(*(long *)&((local_390.ht)->settings).
                             super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.super_Hasher
                  + 8))();
    }
  }
  puVar10 = local_398;
  if (local_398 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_398 != local_398 + 2) {
      operator_delete((undefined8 *)*local_398);
    }
    operator_delete(puVar10);
  }
  local_3a0.data_._0_4_ = 0;
  local_3a8.data_._0_4_ = UniqueObjectHelper<int>(0x2b66);
  local_3a8.data_._0_4_ = -(int)local_3a8.data_;
  pVar17 = google::
           sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
           ::find_position<int>(this_00,(int *)&local_3a8);
  local_390.ht = (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)(ulong)(pVar17.first != 0xffffffffffffffff);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_348,"0u","this->ht_.count(this->UniqueKey(11110))",(uint *)&local_3a0
             ,(unsigned_long *)&local_390);
  if (local_348[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_390);
    if ((pointer)local_348._8_8_ == (pointer)0x0) {
      piVar14 = (pointer)0xafc493;
    }
    else {
      piVar14 = *(pointer *)local_348._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x2f2,(char *)piVar14);
    testing::internal::AssertHelper::operator=(&local_3a0,(Message *)&local_390);
    testing::internal::AssertHelper::~AssertHelper(&local_3a0);
    if (local_390.ht !=
        (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      (**(code **)(*(long *)&((local_390.ht)->settings).
                             super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.super_Hasher
                  + 8))();
    }
  }
  uVar3 = local_348._8_8_;
  if ((pointer)local_348._8_8_ != (pointer)0x0) {
    if ((int **)*(pointer *)local_348._8_8_ !=
        &(((Settings *)(local_348._8_8_ + 8))->
         super_alloc_impl<Alloc<int,_unsigned_long,_18446744073709551615UL>_>).
         super_Alloc<int,_unsigned_long,_18446744073709551615UL>.count_) {
      operator_delete(*(pointer *)local_348._8_8_);
    }
    operator_delete((void *)uVar3);
  }
  iVar4 = UniqueObjectHelper<int>(0x2b66);
  local_390.ht = (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)CONCAT44(local_390.ht._4_4_,-iVar4);
  google::
  sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::equal_range<int>((pair<google::sparse_hashtable_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_google::sparse_hashtable_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      *)local_348,this_00,(int *)&local_390);
  puVar10 = (undefined8 *)local_348;
  psVar12 = &local_2b8;
  for (lVar8 = 9; lVar8 != 0; lVar8 = lVar8 + -1) {
    psVar12->ht = (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                   *)*puVar10;
    puVar10 = puVar10 + (ulong)bVar16 * -2 + 1;
    psVar12 = (sparse_hashtable_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
               *)((long)psVar12 + ((ulong)bVar16 * -2 + 1) * 8);
  }
  ppsVar11 = local_300;
  puVar10 = &local_268;
  for (lVar8 = 9; lVar8 != 0; lVar8 = lVar8 + -1) {
    *puVar10 = *ppsVar11;
    ppsVar11 = ppsVar11 + (ulong)bVar16 * -2 + 1;
    puVar10 = puVar10 + (ulong)bVar16 * -2 + 1;
  }
  if (((local_2b8.pos.row_begin._M_current == local_260) &&
      (local_2b8.pos.row_end._M_current == psStack_258)) &&
     (local_2b8.pos.row_current._M_current == local_250)) {
    if (local_2b8.pos.row_current._M_current == local_2b8.pos.row_end._M_current) {
      bVar15 = true;
    }
    else {
      bVar15 = local_2b8.pos.col_current == piStack_248;
    }
  }
  else {
    bVar15 = false;
  }
  local_390.ht = (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)CONCAT71(local_390.ht._1_7_,bVar15);
  local_390.pos.row_begin._M_current =
       (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
       0x0;
  local_270 = pHVar1;
  local_220 = pHVar1;
  if (bVar15 == false) {
    testing::Message::Message((Message *)&local_3a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_348,(internal *)&local_390,
               (AssertionResult *)"eq_pair.first == eq_pair.second","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x2f4,(char *)local_348._0_8_);
    testing::internal::AssertHelper::operator=(&local_3a8,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_348._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_338) {
      operator_delete((void *)local_348._0_8_);
    }
    if ((long *)CONCAT44(local_3a0.data_._4_4_,(int)local_3a0.data_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_3a0.data_._4_4_,(int)local_3a0.data_) + 8))();
    }
  }
  iVar6._M_current = local_390.pos.row_begin._M_current;
  if (local_390.pos.row_begin._M_current !=
      (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
      0x0) {
    if ((int **)(local_390.pos.row_begin._M_current)->group !=
        &((local_390.pos.row_begin._M_current)->settings).
         super_alloc_impl<Alloc<int,_unsigned_long,_18446744073709551615UL>_>.
         super_Alloc<int,_unsigned_long,_18446744073709551615UL>.count_) {
      operator_delete((local_390.pos.row_begin._M_current)->group);
    }
    operator_delete(iVar6._M_current);
  }
  local_3a8.data_._0_4_ = UniqueObjectHelper<int>(0x2b66);
  local_3a8.data_._0_4_ = -(int)local_3a8.data_;
  google::
  sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::find<int>((const_iterator *)local_348,
              (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
               *)local_120,(int *)&local_3a8);
  local_390.pos.row_begin._M_current =
       local_d8[0].
       super__Vector_base<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_390.pos.row_end._M_current =
       local_d8[0].
       super__Vector_base<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_390.pos.row_current._M_current =
       local_d8[0].
       super__Vector_base<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_390.pos.col_current = (nonempty_iterator)0x0;
  local_390.end.row_begin._M_current =
       local_d8[0].
       super__Vector_base<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_390.end.row_end._M_current =
       local_d8[0].
       super__Vector_base<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_390.end.row_current._M_current =
       local_d8[0].
       super__Vector_base<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_390.end.col_current = (nonempty_iterator)0x0;
  local_390.ht = (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)local_120;
  local_300[0] = (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)local_128;
  google::
  sparse_hashtable_const_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::advance_past_deleted
            ((sparse_hashtable_const_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)&local_390);
  if ((((sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
        local_348._8_8_ == local_390.pos.row_begin._M_current) &&
      ((sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
       local_338._0_8_ == local_390.pos.row_end._M_current)) &&
     ((sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
      local_338._8_8_ == local_390.pos.row_current._M_current)) {
    if (local_338._8_8_ == local_338._0_8_) {
      bVar15 = true;
    }
    else {
      bVar15 = (nonempty_iterator)local_338._16_8_ == local_390.pos.col_current;
    }
  }
  else {
    bVar15 = false;
  }
  local_3a0.data_._0_4_ = CONCAT31(local_3a0.data_._1_3_,bVar15);
  local_398 = (undefined8 *)0x0;
  if (bVar15 == false) {
    testing::Message::Message((Message *)&local_390);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_348,(internal *)&local_3a0,
               (AssertionResult *)"ht.find(this->UniqueKey(11110)) == ht.end()","false","true",in_R9
              );
    testing::internal::AssertHelper::AssertHelper
              (&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x2f6,(char *)local_348._0_8_);
    testing::internal::AssertHelper::operator=(&local_3a8,(Message *)&local_390);
    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
    if ((undefined1 *)local_348._0_8_ != local_338) {
      operator_delete((void *)local_348._0_8_);
    }
    if (local_390.ht !=
        (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      (**(code **)(*(long *)&((local_390.ht)->settings).
                             super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.super_Hasher
                  + 8))();
    }
  }
  puVar10 = local_398;
  if (local_398 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_398 != local_398 + 2) {
      operator_delete((undefined8 *)*local_398);
    }
    operator_delete(puVar10);
  }
  local_3a0.data_._0_4_ = 0;
  local_3a8.data_._0_4_ = UniqueObjectHelper<int>(0x2b66);
  local_3a8.data_._0_4_ = -(int)local_3a8.data_;
  pVar17 = google::
           sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
           ::find_position<int>
                     ((sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                       *)local_120,(int *)&local_3a8);
  local_390.ht = (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)(ulong)(pVar17.first != 0xffffffffffffffff);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_348,"0u","ht.count(this->UniqueKey(11110))",(uint *)&local_3a0,
             (unsigned_long *)&local_390);
  if (local_348[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_390);
    if ((pointer)local_348._8_8_ == (pointer)0x0) {
      piVar14 = (pointer)0xafc493;
    }
    else {
      piVar14 = *(pointer *)local_348._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x2f7,(char *)piVar14);
    testing::internal::AssertHelper::operator=(&local_3a0,(Message *)&local_390);
    testing::internal::AssertHelper::~AssertHelper(&local_3a0);
    if (local_390.ht !=
        (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      (**(code **)(*(long *)&((local_390.ht)->settings).
                             super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.super_Hasher
                  + 8))();
    }
  }
  uVar3 = local_348._8_8_;
  if ((pointer)local_348._8_8_ != (pointer)0x0) {
    if ((int **)*(pointer *)local_348._8_8_ !=
        &(((Settings *)(local_348._8_8_ + 8))->
         super_alloc_impl<Alloc<int,_unsigned_long,_18446744073709551615UL>_>).
         super_Alloc<int,_unsigned_long,_18446744073709551615UL>.count_) {
      operator_delete(*(pointer *)local_348._8_8_);
    }
    operator_delete((void *)uVar3);
  }
  iVar4 = UniqueObjectHelper<int>(0x2b66);
  local_390.ht = (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)CONCAT44(local_390.ht._4_4_,-iVar4);
  google::
  sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::equal_range<int>((pair<google::sparse_hashtable_const_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_google::sparse_hashtable_const_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      *)local_348,
                     (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                      *)local_120,(int *)&local_390);
  puVar10 = (undefined8 *)local_348;
  psVar13 = &local_218;
  for (lVar8 = 9; lVar8 != 0; lVar8 = lVar8 + -1) {
    psVar13->ht = (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                   *)*puVar10;
    puVar10 = puVar10 + (ulong)bVar16 * -2 + 1;
    psVar13 = (sparse_hashtable_const_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
               *)((long)psVar13 + ((ulong)bVar16 * -2 + 1) * 8);
  }
  ppsVar11 = local_300;
  puVar10 = &local_1c8;
  for (lVar8 = 9; lVar8 != 0; lVar8 = lVar8 + -1) {
    *puVar10 = *ppsVar11;
    ppsVar11 = ppsVar11 + (ulong)bVar16 * -2 + 1;
    puVar10 = puVar10 + (ulong)bVar16 * -2 + 1;
  }
  if (((local_218.pos.row_begin._M_current == local_1c0) &&
      (local_218.pos.row_end._M_current == psStack_1b8)) &&
     (local_218.pos.row_current._M_current == local_1b0)) {
    if (local_218.pos.row_current._M_current == local_218.pos.row_end._M_current) {
      bVar15 = true;
    }
    else {
      bVar15 = local_218.pos.col_current == piStack_1a8;
    }
  }
  else {
    bVar15 = false;
  }
  local_390.ht = (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)CONCAT71(local_390.ht._1_7_,bVar15);
  local_390.pos.row_begin._M_current =
       (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
       0x0;
  local_1d0 = (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
               *)local_128;
  local_180 = (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
               *)local_128;
  if (bVar15 == false) {
    testing::Message::Message((Message *)&local_3a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_348,(internal *)&local_390,
               (AssertionResult *)"const_eq_pair.first == const_eq_pair.second","false","true",in_R9
              );
    testing::internal::AssertHelper::AssertHelper
              (&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x2f9,(char *)local_348._0_8_);
    testing::internal::AssertHelper::operator=(&local_3a8,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_348._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_338) {
      operator_delete((void *)local_348._0_8_);
    }
    if ((long *)CONCAT44(local_3a0.data_._4_4_,(int)local_3a0.data_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_3a0.data_._4_4_,(int)local_3a0.data_) + 8))();
    }
  }
  iVar6._M_current = local_390.pos.row_begin._M_current;
  if (local_390.pos.row_begin._M_current !=
      (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
      0x0) {
    if ((int **)(local_390.pos.row_begin._M_current)->group !=
        &((local_390.pos.row_begin._M_current)->settings).
         super_alloc_impl<Alloc<int,_unsigned_long,_18446744073709551615UL>_>.
         super_Alloc<int,_unsigned_long,_18446744073709551615UL>.count_) {
      operator_delete((local_390.pos.row_begin._M_current)->group);
    }
    operator_delete(iVar6._M_current);
  }
  local_128 = (undefined1  [8])&PTR__BaseHashtableInterface_00c231b8;
  std::
  vector<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
  ::~vector(local_d8);
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, FindAndCountAndEqualRange) {
  pair<typename TypeParam::iterator, typename TypeParam::iterator> eq_pair;
  pair<typename TypeParam::const_iterator, typename TypeParam::const_iterator>
      const_eq_pair;

  EXPECT_TRUE(this->ht_.empty());
  EXPECT_TRUE(this->ht_.find(this->UniqueKey(1)) == this->ht_.end());
  EXPECT_EQ(0u, this->ht_.count(this->UniqueKey(1)));
  eq_pair = this->ht_.equal_range(this->UniqueKey(1));
  EXPECT_TRUE(eq_pair.first == eq_pair.second);

  this->ht_.insert(this->UniqueObject(1));
  EXPECT_FALSE(this->ht_.empty());
  this->ht_.insert(this->UniqueObject(11));
  this->ht_.insert(this->UniqueObject(111));
  this->ht_.insert(this->UniqueObject(1111));
  this->ht_.insert(this->UniqueObject(11111));
  this->ht_.insert(this->UniqueObject(111111));
  this->ht_.insert(this->UniqueObject(1111111));
  this->ht_.insert(this->UniqueObject(11111111));
  this->ht_.insert(this->UniqueObject(111111111));
  EXPECT_EQ(9u, this->ht_.size());
  typename TypeParam::const_iterator it = this->ht_.find(this->UniqueKey(1));
  EXPECT_EQ(it.key(), this->UniqueKey(1));

  // Allow testing the const version of the methods as well.
  const TypeParam ht = this->ht_;

  // Some successful lookups (via find, count, and equal_range).
  EXPECT_TRUE(this->ht_.find(this->UniqueKey(1)) != this->ht_.end());
  EXPECT_EQ(1u, this->ht_.count(this->UniqueKey(1)));
  eq_pair = this->ht_.equal_range(this->UniqueKey(1));
  EXPECT_TRUE(eq_pair.first != eq_pair.second);
  EXPECT_EQ(eq_pair.first.key(), this->UniqueKey(1));
  ++eq_pair.first;
  EXPECT_TRUE(eq_pair.first == eq_pair.second);

  EXPECT_TRUE(ht.find(this->UniqueKey(1)) != ht.end());
  EXPECT_EQ(1u, ht.count(this->UniqueKey(1)));
  const_eq_pair = ht.equal_range(this->UniqueKey(1));
  EXPECT_TRUE(const_eq_pair.first != const_eq_pair.second);
  EXPECT_EQ(const_eq_pair.first.key(), this->UniqueKey(1));
  ++const_eq_pair.first;
  EXPECT_TRUE(const_eq_pair.first == const_eq_pair.second);

  EXPECT_TRUE(this->ht_.find(this->UniqueKey(11111)) != this->ht_.end());
  EXPECT_EQ(1u, this->ht_.count(this->UniqueKey(11111)));
  eq_pair = this->ht_.equal_range(this->UniqueKey(11111));
  EXPECT_TRUE(eq_pair.first != eq_pair.second);
  EXPECT_EQ(eq_pair.first.key(), this->UniqueKey(11111));
  ++eq_pair.first;
  EXPECT_TRUE(eq_pair.first == eq_pair.second);

  EXPECT_TRUE(ht.find(this->UniqueKey(11111)) != ht.end());
  EXPECT_EQ(1u, ht.count(this->UniqueKey(11111)));
  const_eq_pair = ht.equal_range(this->UniqueKey(11111));
  EXPECT_TRUE(const_eq_pair.first != const_eq_pair.second);
  EXPECT_EQ(const_eq_pair.first.key(), this->UniqueKey(11111));
  ++const_eq_pair.first;
  EXPECT_TRUE(const_eq_pair.first == const_eq_pair.second);

  // Some unsuccessful lookups (via find, count, and equal_range).
  EXPECT_TRUE(this->ht_.find(this->UniqueKey(11112)) == this->ht_.end());
  EXPECT_EQ(0u, this->ht_.count(this->UniqueKey(11112)));
  eq_pair = this->ht_.equal_range(this->UniqueKey(11112));
  EXPECT_TRUE(eq_pair.first == eq_pair.second);

  EXPECT_TRUE(ht.find(this->UniqueKey(11112)) == ht.end());
  EXPECT_EQ(0u, ht.count(this->UniqueKey(11112)));
  const_eq_pair = ht.equal_range(this->UniqueKey(11112));
  EXPECT_TRUE(const_eq_pair.first == const_eq_pair.second);

  EXPECT_TRUE(this->ht_.find(this->UniqueKey(11110)) == this->ht_.end());
  EXPECT_EQ(0u, this->ht_.count(this->UniqueKey(11110)));
  eq_pair = this->ht_.equal_range(this->UniqueKey(11110));
  EXPECT_TRUE(eq_pair.first == eq_pair.second);

  EXPECT_TRUE(ht.find(this->UniqueKey(11110)) == ht.end());
  EXPECT_EQ(0u, ht.count(this->UniqueKey(11110)));
  const_eq_pair = ht.equal_range(this->UniqueKey(11110));
  EXPECT_TRUE(const_eq_pair.first == const_eq_pair.second);
}